

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O2

pair<RenX::LadderDatabase::Entry_*,_unsigned_long> __thiscall
RenX::LadderDatabase::getPlayerEntryAndIndex(LadderDatabase *this,uint64_t steamid)

{
  Entry *pEVar1;
  Entry **ppEVar2;
  unsigned_long uVar3;
  pair<RenX::LadderDatabase::Entry_*,_unsigned_long> pVar5;
  unsigned_long uVar4;
  
  uVar3 = 0;
  ppEVar2 = &this->m_head;
  while ((pEVar1 = *ppEVar2, uVar4 = 0xffffffffffffffff, pEVar1 != (Entry *)0x0 &&
         (uVar4 = uVar3, pEVar1->steam_id != steamid))) {
    uVar3 = uVar3 + 1;
    ppEVar2 = &pEVar1->next;
  }
  pVar5.second = uVar4;
  pVar5.first = pEVar1;
  return pVar5;
}

Assistant:

std::pair<RenX::LadderDatabase::Entry *, size_t> RenX::LadderDatabase::getPlayerEntryAndIndex(uint64_t steamid) const {
	size_t index = 0;
	for (Entry *itr = m_head; itr != nullptr; itr = itr->next, ++index) {
		if (itr->steam_id == steamid) {
			return std::pair<Entry*, size_t>(itr, index);
		}
	}
	return std::pair<Entry*, size_t>(nullptr, SIZE_MAX);
}